

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O2

line_t_conflict * FindDestination(line_t_conflict *src,int tag)

{
  uint uVar1;
  FLineIdIterator it;
  FLineIdIterator local_20;
  
  if (tag == 0) {
    return (line_t_conflict *)0x0;
  }
  local_20.start = tagManager.IDHashFirst[tag & 0xff];
  local_20.searchtag = tag;
  do {
    uVar1 = FLineIdIterator::Next(&local_20);
    if ((int)uVar1 < 0) {
      return (line_t_conflict *)0x0;
    }
  } while (lines + uVar1 == src);
  return lines + uVar1;
}

Assistant:

static line_t *FindDestination(line_t *src, int tag)
{
	if (tag)
	{
		int lineno = -1;
		FLineIdIterator it(tag);

		while ((lineno = it.Next()) >= 0)
		{
			if (&lines[lineno] != src)
			{
				return &lines[lineno];
			}
		}
	}
	return NULL;
}